

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

void __thiscall
CPP::WriteInitialization::writePixmapFunctionIcon
          (WriteInitialization *this,QTextStream *output,QString *iconName,QString *indent,
          DomResourceIcon *i)

{
  DomResourcePixmap *pDVar1;
  char cVar2;
  uint uVar3;
  long in_FS_OFFSET;
  QLatin1StringView t;
  QLatin1StringView t_00;
  QLatin1StringView t_01;
  QLatin1StringView t_02;
  QLatin1StringView t_03;
  QLatin1StringView t_04;
  QLatin1StringView t_05;
  QLatin1StringView t_06;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = i->m_children;
  if ((uVar3 & 1) != 0) {
    pDVar1 = i->m_normalOff;
    local_68.d = (pDVar1->m_text).d.d;
    local_68.ptr = (pDVar1->m_text).d.ptr;
    local_68.size = (pDVar1->m_text).d.size;
    if (local_68.d != (Data *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    t.m_data = "QPixmap";
    t.m_size = 7;
    pixCall((QString *)&local_50,this,t,(QString *)&local_68);
    writeIconAddPixmap(output,indent,iconName,(QString *)&local_50,"Normal","Off");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    uVar3 = i->m_children;
  }
  if ((uVar3 & 2) != 0) {
    pDVar1 = i->m_normalOn;
    local_68.d = (pDVar1->m_text).d.d;
    local_68.ptr = (pDVar1->m_text).d.ptr;
    local_68.size = (pDVar1->m_text).d.size;
    if (local_68.d != (Data *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    t_00.m_data = "QPixmap";
    t_00.m_size = 7;
    pixCall((QString *)&local_50,this,t_00,(QString *)&local_68);
    writeIconAddPixmap(output,indent,iconName,(QString *)&local_50,"Normal","On");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    uVar3 = i->m_children;
  }
  if ((uVar3 & 4) != 0) {
    pDVar1 = i->m_disabledOff;
    local_68.d = (pDVar1->m_text).d.d;
    local_68.ptr = (pDVar1->m_text).d.ptr;
    local_68.size = (pDVar1->m_text).d.size;
    if (local_68.d != (Data *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    t_01.m_data = "QPixmap";
    t_01.m_size = 7;
    pixCall((QString *)&local_50,this,t_01,(QString *)&local_68);
    writeIconAddPixmap(output,indent,iconName,(QString *)&local_50,"Disabled","Off");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    uVar3 = i->m_children;
  }
  if ((uVar3 & 8) != 0) {
    pDVar1 = i->m_disabledOn;
    local_68.d = (pDVar1->m_text).d.d;
    local_68.ptr = (pDVar1->m_text).d.ptr;
    local_68.size = (pDVar1->m_text).d.size;
    if (local_68.d != (Data *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    t_02.m_data = "QPixmap";
    t_02.m_size = 7;
    pixCall((QString *)&local_50,this,t_02,(QString *)&local_68);
    writeIconAddPixmap(output,indent,iconName,(QString *)&local_50,"Disabled","On");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    uVar3 = i->m_children;
  }
  if ((uVar3 & 0x10) != 0) {
    pDVar1 = i->m_activeOff;
    local_68.d = (pDVar1->m_text).d.d;
    local_68.ptr = (pDVar1->m_text).d.ptr;
    local_68.size = (pDVar1->m_text).d.size;
    if (local_68.d != (Data *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    t_03.m_data = "QPixmap";
    t_03.m_size = 7;
    pixCall((QString *)&local_50,this,t_03,(QString *)&local_68);
    writeIconAddPixmap(output,indent,iconName,(QString *)&local_50,"Active","Off");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    uVar3 = i->m_children;
  }
  if ((uVar3 & 0x20) != 0) {
    pDVar1 = i->m_activeOn;
    local_68.d = (pDVar1->m_text).d.d;
    local_68.ptr = (pDVar1->m_text).d.ptr;
    local_68.size = (pDVar1->m_text).d.size;
    if (local_68.d != (Data *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    t_04.m_data = "QPixmap";
    t_04.m_size = 7;
    pixCall((QString *)&local_50,this,t_04,(QString *)&local_68);
    writeIconAddPixmap(output,indent,iconName,(QString *)&local_50,"Active","On");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    uVar3 = i->m_children;
  }
  cVar2 = (char)uVar3;
  if ((uVar3 & 0x40) != 0) {
    pDVar1 = i->m_selectedOff;
    local_68.d = (pDVar1->m_text).d.d;
    local_68.ptr = (pDVar1->m_text).d.ptr;
    local_68.size = (pDVar1->m_text).d.size;
    if (local_68.d != (Data *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    t_05.m_data = "QPixmap";
    t_05.m_size = 7;
    pixCall((QString *)&local_50,this,t_05,(QString *)&local_68);
    writeIconAddPixmap(output,indent,iconName,(QString *)&local_50,"Selected","Off");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    cVar2 = (char)i->m_children;
  }
  if (cVar2 < '\0') {
    pDVar1 = i->m_selectedOn;
    local_68.d = (pDVar1->m_text).d.d;
    local_68.ptr = (pDVar1->m_text).d.ptr;
    local_68.size = (pDVar1->m_text).d.size;
    if (local_68.d != (Data *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    t_06.m_data = "QPixmap";
    t_06.m_size = 7;
    pixCall((QString *)&local_50,this,t_06,(QString *)&local_68);
    writeIconAddPixmap(output,indent,iconName,(QString *)&local_50,"Selected","On");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteInitialization::writePixmapFunctionIcon(QTextStream &output,
                                                  const QString &iconName,
                                                  const QString &indent,
                                                  const DomResourceIcon *i) const
{
    if (i->hasElementNormalOff()) {
        writeIconAddPixmap(output, indent,  iconName,
                           pixCall("QPixmap"_L1, i->elementNormalOff()->text()),
                           "Normal", "Off");
    }
    if (i->hasElementNormalOn()) {
        writeIconAddPixmap(output, indent,  iconName,
                           pixCall("QPixmap"_L1, i->elementNormalOn()->text()),
                           "Normal", "On");
    }
    if (i->hasElementDisabledOff()) {
        writeIconAddPixmap(output, indent,  iconName,
                           pixCall("QPixmap"_L1, i->elementDisabledOff()->text()),
                           "Disabled", "Off");
    }
    if (i->hasElementDisabledOn()) {
        writeIconAddPixmap(output, indent,  iconName,
                           pixCall("QPixmap"_L1, i->elementDisabledOn()->text()),
                           "Disabled", "On");
    }
    if (i->hasElementActiveOff()) {
        writeIconAddPixmap(output, indent,  iconName,
                           pixCall("QPixmap"_L1, i->elementActiveOff()->text()),
                           "Active", "Off");
    }
    if (i->hasElementActiveOn()) {
        writeIconAddPixmap(output, indent,  iconName,
                           pixCall("QPixmap"_L1, i->elementActiveOn()->text()),
                           "Active", "On");
    }
    if (i->hasElementSelectedOff()) {
        writeIconAddPixmap(output, indent,  iconName,
                           pixCall("QPixmap"_L1, i->elementSelectedOff()->text()),
                           "Selected", "Off");
    }
    if (i->hasElementSelectedOn()) {
        writeIconAddPixmap(output, indent,  iconName,
                           pixCall("QPixmap"_L1, i->elementSelectedOn()->text()),
                           "Selected", "On");
    }
}